

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msaa.c
# Opt level: O3

int main(int argc,char **argv)

{
  uint value;
  int iVar1;
  GLuint GVar2;
  GLuint GVar3;
  GLuint GVar4;
  GLint GVar5;
  GLFWwindow *handle;
  float *pfVar6;
  uint *puVar7;
  int i;
  long lVar8;
  long lVar9;
  long lVar10;
  float fVar11;
  float fVar12;
  double dVar13;
  int iVar14;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  int samples;
  int height;
  int width;
  mat4x4 temp;
  GLuint vertex_buffer;
  mat4x4 mvp;
  uint local_1a8;
  GLuint local_1a4;
  int local_1a0;
  int local_19c;
  undefined1 local_198 [16];
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  ulong uStack_150;
  float local_148;
  uint local_144;
  undefined8 local_140;
  uint local_138;
  float local_134;
  undefined1 local_130 [16];
  undefined4 local_120;
  undefined1 local_11c [16];
  undefined4 local_10c;
  GLuint local_fc;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  ulong uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  ulong uStack_80;
  float local_78 [5];
  undefined1 local_64 [16];
  undefined8 local_54;
  undefined4 local_4c;
  float local_48;
  undefined8 local_44;
  undefined4 local_3c;
  
  local_1a8 = 4;
  while( true ) {
    value = local_1a8;
    iVar1 = getopt(argc,argv,"hs:");
    if (iVar1 != 0x73) break;
    local_1a8 = atoi(optarg);
  }
  if (iVar1 == -1) {
    glfwSetErrorCallback(error_callback);
    iVar1 = glfwInit();
    if (iVar1 != 0) {
      if (value == 0) {
        puts("Requesting that MSAA not be available");
      }
      else {
        printf("Requesting MSAA with %i samples\n",(ulong)value);
      }
      glfwWindowHint(0x2100d,value);
      glfwWindowHint(0x22002,2);
      glfwWindowHint(0x22003,0);
      handle = glfwCreateWindow(800,400,"Aliasing Detector",(GLFWmonitor *)0x0,(GLFWwindow *)0x0);
      if (handle != (GLFWwindow *)0x0) {
        glfwSetKeyCallback(handle,key_callback);
        glfwMakeContextCurrent(handle);
        gladLoadGLLoader(glfwGetProcAddress);
        glfwSwapInterval(1);
        (*glad_glGetIntegerv)(0x80a9,(GLint *)&local_1a8);
        if (local_1a8 == 0) {
          puts("Context reports MSAA is unavailable");
        }
        else {
          printf("Context reports MSAA is available with %i samples\n");
        }
        (*glad_glGenBuffers)(1,&local_fc);
        (*glad_glBindBuffer)(0x8892,local_fc);
        (*glad_glBufferData)(0x8892,0x20,vertices,0x88e4);
        GVar2 = (*glad_glCreateShader)(0x8b31);
        (*glad_glShaderSource)(GVar2,1,&vertex_shader_text,(GLint *)0x0);
        (*glad_glCompileShader)(GVar2);
        GVar3 = (*glad_glCreateShader)(0x8b30);
        (*glad_glShaderSource)(GVar3,1,&fragment_shader_text,(GLint *)0x0);
        (*glad_glCompileShader)(GVar3);
        GVar4 = (*glad_glCreateProgram)();
        (*glad_glAttachShader)(GVar4,GVar2);
        (*glad_glAttachShader)(GVar4,GVar3);
        (*glad_glLinkProgram)(GVar4);
        GVar5 = (*glad_glGetUniformLocation)(GVar4,"MVP");
        local_1a4 = GVar4;
        GVar2 = (*glad_glGetAttribLocation)(GVar4,"vPos");
        (*glad_glEnableVertexAttribArray)(GVar2);
        (*glad_glVertexAttribPointer)(GVar2,2,0x1406,'\0',8,(void *)0x0);
        iVar1 = glfwWindowShouldClose(handle);
        if (iVar1 == 0) {
          do {
            dVar13 = glfwGetTime();
            glfwGetFramebufferSize(handle,&local_19c,&local_1a0);
            local_198 = ZEXT416((uint)((float)local_19c / (float)local_1a0));
            (*glad_glViewport)(0,0,local_19c,local_1a0);
            (*glad_glClear)(0x4000);
            (*glad_glUseProgram)(local_1a4);
            local_78[0] = 2.0 / ((float)local_198._0_4_ + (float)local_198._0_4_);
            local_78[1] = 0.0;
            local_78[2] = 0.0;
            local_78[3] = 0.0;
            local_78[4] = 0.0;
            local_4c = 0;
            local_54 = 0xc000000000000000;
            local_64._0_12_ = ZEXT812(0x3f800000);
            local_64._12_4_ = 0;
            local_48 = -((float)local_198._0_4_ - (float)local_198._0_4_) /
                       ((float)local_198._0_4_ + (float)local_198._0_4_);
            local_44 = 0xbf80000080000000;
            local_3c = 0x3f800000;
            lVar8 = 0;
            puVar7 = (uint *)&local_f8;
            do {
              iVar1 = (int)lVar8;
              iVar14 = (int)((ulong)lVar8 >> 0x20);
              *puVar7 = -(uint)(iVar1 == 0 && iVar14 == 0) & 0x3f800000;
              puVar7[1] = -(uint)(iVar1 == 1 && iVar14 == 0) & 0x3f800000;
              puVar7[2] = -(uint)(iVar1 == 2 && iVar14 == 0) & 0x3f800000;
              puVar7[3] = -(uint)(iVar1 == 3 && iVar14 == 0) & 0x3f800000;
              lVar8 = lVar8 + 1;
              puVar7 = puVar7 + 4;
            } while (lVar8 != 4);
            local_c8 = 0xbf800000;
            uStack_c0 = uStack_c0 & 0xffffffff00000000;
            fVar11 = (float)((dVar13 * 3.141592653589793) / 180.0);
            local_198._0_4_ = sinf(fVar11);
            local_198._4_4_ = extraout_XMM0_Db;
            local_198._8_4_ = extraout_XMM0_Dc;
            local_198._12_4_ = extraout_XMM0_Dd;
            local_148 = cosf(fVar11);
            local_144 = local_198._0_4_;
            local_140 = 0;
            local_138 = local_198._0_4_ ^ 0x80000000;
            local_134 = local_148;
            local_130._0_12_ = ZEXT812(0);
            local_130._12_4_ = 0;
            local_120 = 0x3f800000;
            local_11c = local_130;
            local_10c = 0x3f800000;
            pfVar6 = &local_148;
            lVar8 = 0;
            do {
              lVar9 = 0;
              puVar7 = (uint *)&local_f8;
              do {
                fVar12 = 0.0;
                lVar10 = 0;
                do {
                  fVar12 = fVar12 + (float)puVar7[lVar10] * *(float *)((long)pfVar6 + lVar10);
                  lVar10 = lVar10 + 4;
                } while (lVar10 != 0x10);
                *(float *)((long)&local_188 + lVar9 * 4 + lVar8 * 0x10) = fVar12;
                lVar9 = lVar9 + 1;
                puVar7 = puVar7 + 1;
              } while (lVar9 != 4);
              lVar8 = lVar8 + 1;
              pfVar6 = pfVar6 + 4;
            } while (lVar8 != 4);
            local_c8 = local_158;
            uStack_c0 = uStack_150;
            local_d8 = local_168;
            uStack_d0 = uStack_160;
            local_e8 = local_178;
            uStack_e0 = uStack_170;
            local_f8 = local_188;
            uStack_f0 = uStack_180;
            lVar8 = 0;
            puVar7 = (uint *)&local_f8;
            do {
              lVar9 = 0;
              pfVar6 = local_78;
              do {
                fVar12 = 0.0;
                lVar10 = 0;
                do {
                  fVar12 = fVar12 + pfVar6[lVar10] * *(float *)((long)puVar7 + lVar10);
                  lVar10 = lVar10 + 4;
                } while (lVar10 != 0x10);
                *(float *)((long)&local_188 + lVar9 * 4 + lVar8 * 0x10) = fVar12;
                lVar9 = lVar9 + 1;
                pfVar6 = pfVar6 + 1;
              } while (lVar9 != 4);
              lVar8 = lVar8 + 1;
              puVar7 = puVar7 + 4;
            } while (lVar8 != 4);
            local_88 = local_158;
            uStack_80 = uStack_150;
            local_98 = local_168;
            uStack_90 = uStack_160;
            local_a8 = local_178;
            uStack_a0 = uStack_170;
            local_b8 = local_188;
            uStack_b0 = uStack_180;
            (*glad_glUniformMatrix4fv)(GVar5,1,'\0',(GLfloat *)&local_b8);
            (*glad_glDisable)(0x809d);
            (*glad_glDrawArrays)(6,0,4);
            lVar8 = 0;
            puVar7 = (uint *)&local_f8;
            do {
              iVar1 = (int)lVar8;
              iVar14 = (int)((ulong)lVar8 >> 0x20);
              *puVar7 = -(uint)(iVar1 == 0 && iVar14 == 0) & 0x3f800000;
              puVar7[1] = -(uint)(iVar1 == 1 && iVar14 == 0) & 0x3f800000;
              puVar7[2] = -(uint)(iVar1 == 2 && iVar14 == 0) & 0x3f800000;
              puVar7[3] = -(uint)(iVar14 == 0 && iVar1 == 3) & 0x3f800000;
              lVar8 = lVar8 + 1;
              puVar7 = puVar7 + 4;
            } while (lVar8 != 4);
            local_c8 = 0x3f800000;
            uStack_c0 = uStack_c0 & 0xffffffff00000000;
            local_198._0_4_ = sinf(fVar11);
            local_198._4_4_ = extraout_XMM0_Db_00;
            local_198._8_4_ = extraout_XMM0_Dc_00;
            local_198._12_4_ = extraout_XMM0_Dd_00;
            local_148 = cosf(fVar11);
            local_144 = local_198._0_4_;
            local_140 = 0;
            local_138 = local_198._0_4_ ^ 0x80000000;
            local_134 = local_148;
            local_130._0_12_ = ZEXT812(0);
            local_130._12_4_ = 0;
            local_120 = 0x3f800000;
            local_11c = local_130;
            local_10c = 0x3f800000;
            pfVar6 = &local_148;
            lVar8 = 0;
            do {
              lVar9 = 0;
              puVar7 = (uint *)&local_f8;
              do {
                fVar11 = 0.0;
                lVar10 = 0;
                do {
                  fVar11 = fVar11 + (float)puVar7[lVar10] * *(float *)((long)pfVar6 + lVar10);
                  lVar10 = lVar10 + 4;
                } while (lVar10 != 0x10);
                *(float *)((long)&local_188 + lVar9 * 4 + lVar8 * 0x10) = fVar11;
                lVar9 = lVar9 + 1;
                puVar7 = puVar7 + 1;
              } while (lVar9 != 4);
              lVar8 = lVar8 + 1;
              pfVar6 = pfVar6 + 4;
            } while (lVar8 != 4);
            local_c8 = local_158;
            uStack_c0 = uStack_150;
            local_d8 = local_168;
            uStack_d0 = uStack_160;
            local_e8 = local_178;
            uStack_e0 = uStack_170;
            local_f8 = local_188;
            uStack_f0 = uStack_180;
            lVar8 = 0;
            puVar7 = (uint *)&local_f8;
            do {
              lVar9 = 0;
              pfVar6 = local_78;
              do {
                fVar11 = 0.0;
                lVar10 = 0;
                do {
                  fVar11 = fVar11 + pfVar6[lVar10] * *(float *)((long)puVar7 + lVar10);
                  lVar10 = lVar10 + 4;
                } while (lVar10 != 0x10);
                *(float *)((long)&local_188 + lVar9 * 4 + lVar8 * 0x10) = fVar11;
                lVar9 = lVar9 + 1;
                pfVar6 = pfVar6 + 1;
              } while (lVar9 != 4);
              lVar8 = lVar8 + 1;
              puVar7 = puVar7 + 4;
            } while (lVar8 != 4);
            local_88 = local_158;
            uStack_80 = uStack_150;
            local_98 = local_168;
            uStack_90 = uStack_160;
            local_a8 = local_178;
            uStack_a0 = uStack_170;
            local_b8 = local_188;
            uStack_b0 = uStack_180;
            (*glad_glUniformMatrix4fv)(GVar5,1,'\0',(GLfloat *)&local_b8);
            (*glad_glEnable)(0x809d);
            (*glad_glDrawArrays)(6,0,4);
            glfwSwapBuffers(handle);
            glfwPollEvents();
            iVar1 = glfwWindowShouldClose(handle);
          } while (iVar1 == 0);
        }
        glfwDestroyWindow(handle);
        glfwTerminate();
        goto LAB_00114382;
      }
      glfwTerminate();
    }
  }
  else {
    if (iVar1 == 0x68) {
      usage();
LAB_00114382:
      exit(0);
    }
    usage();
  }
  exit(1);
}

Assistant:

int main(int argc, char** argv)
{
    int ch, samples = 4;
    GLFWwindow* window;
    GLuint vertex_buffer, vertex_shader, fragment_shader, program;
    GLint mvp_location, vpos_location;

    while ((ch = getopt(argc, argv, "hs:")) != -1)
    {
        switch (ch)
        {
            case 'h':
                usage();
                exit(EXIT_SUCCESS);
            case 's':
                samples = atoi(optarg);
                break;
            default:
                usage();
                exit(EXIT_FAILURE);
        }
    }

    glfwSetErrorCallback(error_callback);

    if (!glfwInit())
        exit(EXIT_FAILURE);

    if (samples)
        printf("Requesting MSAA with %i samples\n", samples);
    else
        printf("Requesting that MSAA not be available\n");

    glfwWindowHint(GLFW_SAMPLES, samples);
    glfwWindowHint(GLFW_CONTEXT_VERSION_MAJOR, 2);
    glfwWindowHint(GLFW_CONTEXT_VERSION_MINOR, 0);

    window = glfwCreateWindow(800, 400, "Aliasing Detector", NULL, NULL);
    if (!window)
    {
        glfwTerminate();
        exit(EXIT_FAILURE);
    }

    glfwSetKeyCallback(window, key_callback);

    glfwMakeContextCurrent(window);
    gladLoadGLLoader((GLADloadproc) glfwGetProcAddress);
    glfwSwapInterval(1);

    glGetIntegerv(GL_SAMPLES, &samples);
    if (samples)
        printf("Context reports MSAA is available with %i samples\n", samples);
    else
        printf("Context reports MSAA is unavailable\n");

    glGenBuffers(1, &vertex_buffer);
    glBindBuffer(GL_ARRAY_BUFFER, vertex_buffer);
    glBufferData(GL_ARRAY_BUFFER, sizeof(vertices), vertices, GL_STATIC_DRAW);

    vertex_shader = glCreateShader(GL_VERTEX_SHADER);
    glShaderSource(vertex_shader, 1, &vertex_shader_text, NULL);
    glCompileShader(vertex_shader);

    fragment_shader = glCreateShader(GL_FRAGMENT_SHADER);
    glShaderSource(fragment_shader, 1, &fragment_shader_text, NULL);
    glCompileShader(fragment_shader);

    program = glCreateProgram();
    glAttachShader(program, vertex_shader);
    glAttachShader(program, fragment_shader);
    glLinkProgram(program);

    mvp_location = glGetUniformLocation(program, "MVP");
    vpos_location = glGetAttribLocation(program, "vPos");

    glEnableVertexAttribArray(vpos_location);
    glVertexAttribPointer(vpos_location, 2, GL_FLOAT, GL_FALSE,
                          sizeof(vertices[0]), (void*) 0);

    while (!glfwWindowShouldClose(window))
    {
        float ratio;
        int width, height;
        mat4x4 m, p, mvp;
        const double angle = glfwGetTime() * M_PI / 180.0;

        glfwGetFramebufferSize(window, &width, &height);
        ratio = width / (float) height;

        glViewport(0, 0, width, height);
        glClear(GL_COLOR_BUFFER_BIT);

        glUseProgram(program);

        mat4x4_ortho(p, -ratio, ratio, -1.f, 1.f, 0.f, 1.f);

        mat4x4_translate(m, -1.f, 0.f, 0.f);
        mat4x4_rotate_Z(m, m, (float) angle);
        mat4x4_mul(mvp, p, m);

        glUniformMatrix4fv(mvp_location, 1, GL_FALSE, (const GLfloat*) mvp);
        glDisable(GL_MULTISAMPLE);
        glDrawArrays(GL_TRIANGLE_FAN, 0, 4);

        mat4x4_translate(m, 1.f, 0.f, 0.f);
        mat4x4_rotate_Z(m, m, (float) angle);
        mat4x4_mul(mvp, p, m);

        glUniformMatrix4fv(mvp_location, 1, GL_FALSE, (const GLfloat*) mvp);
        glEnable(GL_MULTISAMPLE);
        glDrawArrays(GL_TRIANGLE_FAN, 0, 4);

        glfwSwapBuffers(window);
        glfwPollEvents();
    }

    glfwDestroyWindow(window);

    glfwTerminate();
    exit(EXIT_SUCCESS);
}